

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_object_physic::update_write(cse_alife_object_physic *this,xr_packet *packet)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  byte bVar10;
  byte bVar11;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 in_EDX;
  uint uVar12;
  undefined8 uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  
  uVar4 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar4 < 0x7a) {
    return;
  }
  if (uVar4 < 0x81) {
    if (this->m_num_items == 0) {
      UNRECOVERED_JUMPTABLE = packet->_vptr_xr_packet[10];
      uVar13 = 0;
    }
    else {
      bVar10 = this->m_num_items & 0x1f;
      bVar11 = bVar10 | 0x20;
      if ((this->m_state).enabled == false) {
        bVar11 = bVar10;
      }
      fVar7 = (this->m_state).linear_vel.field_0.field_0.x;
      fVar8 = (this->m_state).linear_vel.field_0.field_0.y;
      fVar9 = (this->m_state).linear_vel.field_0.field_0.z;
      fVar1 = (this->m_state).angular_vel.field_0.field_0.y;
      fVar2 = (this->m_state).angular_vel.field_0.field_0.x;
      fVar3 = (this->m_state).angular_vel.field_0.field_0.z;
      iVar15 = -(uint)(fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8 < 1e-07);
      iVar16 = -(uint)(fVar3 * fVar3 + fVar2 * fVar2 + fVar1 * fVar1 < 1e-07);
      auVar5._4_4_ = iVar15;
      auVar5._0_4_ = iVar15;
      auVar5._8_4_ = iVar16;
      auVar5._12_4_ = iVar16;
      uVar12 = movmskpd(in_EDX,auVar5);
      uVar6 = bVar11 + 0x40;
      if ((uVar12 & 2) == 0) {
        uVar6 = (uint)bVar11;
      }
      uVar14 = (ulong)(byte)((byte)uVar6 | 0x80);
      if ((uVar12 & 1) == 0) {
        uVar14 = (ulong)uVar6;
      }
      (*packet->_vptr_xr_packet[10])(packet,uVar14);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).force);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).torque);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).position);
      (*packet->_vptr_xr_packet[0xd])((this->m_state).field_6.max_velocity,packet);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 4),packet);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 8),packet);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 0xc),packet);
      if ((uVar14 & 0x40) == 0) {
        (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).angular_vel);
      }
      if (-1 < (char)uVar14) {
        (*packet->_vptr_xr_packet[0xf])(packet,&this->m_state);
      }
      UNRECOVERED_JUMPTABLE = packet->_vptr_xr_packet[0xc];
      uVar13 = 1;
    }
    (*UNRECOVERED_JUMPTABLE)(packet,uVar13);
    return;
  }
  __assert_fail("m_version <= CSE_VERSION_COP",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                ,0x282,"virtual void xray_re::cse_alife_object_physic::update_write(xr_packet &)");
}

Assistant:

void cse_alife_object_physic::update_write(xr_packet& packet)
{
	cse_ph_skeleton::update_write(packet);
	if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_COP);
		if (m_num_items) {
			uint8_t num_items = uint8_t(m_num_items & 0x1f);
			if (m_state.enabled)
				num_items |= 0x20;
			if (m_state.angular_vel.square_magnitude() < 1e-7f)
				num_items |= 0x40;
			if (m_state.linear_vel.square_magnitude() < 1e-7f)
				num_items |= 0x80;
			packet.w_u8(num_items);
			packet.w_vec3(m_state.force);
			packet.w_vec3(m_state.torque);
			packet.w_vec3(m_state.position);
			packet.w_float(m_state.quaternion.x);
			packet.w_float(m_state.quaternion.y);
			packet.w_float(m_state.quaternion.z);
			packet.w_float(m_state.quaternion.w);
			if ((num_items & 0x40) == 0)
				packet.w_vec3(m_state.angular_vel);
			if ((num_items & 0x80) == 0)
				packet.w_vec3(m_state.linear_vel);
			packet.w_bool(true);
		} else {
			packet.w_u8(0);
		}
	}
}